

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexSeparableKernel::adjustSubfaceToMain(PtexSeparableKernel *this,int eid)

{
  int8_t *piVar1;
  byte bVar2;
  
  switch(eid & 3) {
  case 0:
    this->v = this->v + (1 << ((this->res).vlog2 & 0x1fU));
    break;
  case 2:
    this->u = this->u + (1 << ((this->res).ulog2 & 0x1fU));
    break;
  case 3:
    bVar2 = (this->res).vlog2;
    this->u = this->u + (1 << ((this->res).ulog2 & 0x1fU));
    this->v = this->v + (1 << (bVar2 & 0x1f));
  }
  (this->res).ulog2 = (this->res).ulog2 + '\x01';
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + '\x01';
  return;
}

Assistant:

void adjustSubfaceToMain(int eid)
    {
        switch (eid&3) {
        case e_bottom: v += res.v(); break;
        case e_right:  break;
        case e_top:    u += res.u(); break;
        case e_left:   u += res.u(); v += res.v(); break;
        }
        res.ulog2++; res.vlog2++;
    }